

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::setSortingEnabled(QTreeView *this,bool enable)

{
  long lVar1;
  undefined8 uVar2;
  int column;
  SortOrder order;
  undefined7 in_register_00000031;
  QTreeViewPrivate *d;
  long in_FS_OFFSET;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  QHeaderView::setSortIndicatorShown(*(QHeaderView **)(lVar1 + 0x590),enable);
  QHeaderView::setSectionsClickable
            (*(QHeaderView **)
              (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget.field_0x8 + 0x590),enable);
  if ((int)CONCAT71(in_register_00000031,enable) == 0) {
    QObject::disconnect((Connection *)(lVar1 + 0x678));
  }
  else {
    column = QHeaderView::sortIndicatorSection
                       (*(QHeaderView **)
                         (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                    super_QFrame.super_QWidget.field_0x8 + 0x590));
    order = QHeaderView::sortIndicatorOrder
                      (*(QHeaderView **)
                        (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget.field_0x8 + 0x590));
    sortByColumn(this,column,order);
    QObjectPrivate::
    connect<void(QHeaderView::*)(int,Qt::SortOrder),void(QTreeViewPrivate::*)(int,Qt::SortOrder)>
              ((Object *)&stack0xffffffffffffffd0,
               *(offset_in_QHeaderView_to_subr *)
                (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget.field_0x8 + 0x590),
               (Object *)QHeaderView::sortIndicatorChanged,0,(ConnectionType)lVar1);
    uVar2 = *(undefined8 *)(lVar1 + 0x678);
    *(undefined8 *)(lVar1 + 0x678) = local_30;
    local_30 = uVar2;
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffd0);
  }
  *(bool *)(lVar1 + 0x5c3) = enable;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::setSortingEnabled(bool enable)
{
    Q_D(QTreeView);
    header()->setSortIndicatorShown(enable);
    header()->setSectionsClickable(enable);
    if (enable) {
        //sortByColumn has to be called before we connect or set the sortingEnabled flag
        // because otherwise it will not call sort on the model.
        sortByColumn(header()->sortIndicatorSection(), header()->sortIndicatorOrder());
        d->sortHeaderConnection =
            QObjectPrivate::connect(header(), &QHeaderView::sortIndicatorChanged,
                                    d, &QTreeViewPrivate::sortIndicatorChanged,
                                    Qt::UniqueConnection);
    } else {
        QObject::disconnect(d->sortHeaderConnection);
    }
    d->sortingEnabled = enable;
}